

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Inst * Inst::unifyVariable(Inst *__return_storage_ptr__,Register r)

{
  initializer_list<Arg> args;
  Arg *local_90;
  Arg local_58;
  iterator local_28;
  undefined8 local_20;
  int local_14;
  Inst *pIStack_10;
  Register r_local;
  
  local_14 = r.r;
  pIStack_10 = __return_storage_ptr__;
  Arg::Arg(&local_58,r);
  local_28 = &local_58;
  local_20 = 1;
  args._M_len = 1;
  args._M_array = local_28;
  Inst(__return_storage_ptr__,UnifyVariable,args);
  local_90 = (Arg *)&local_28;
  do {
    local_90 = local_90 + -1;
    Arg::~Arg(local_90);
  } while (local_90 != &local_58);
  return __return_storage_ptr__;
}

Assistant:

static Inst unifyVariable(Register r) {
    return Inst(InstTag::UnifyVariable, {r});
    }